

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<int,int>::emplace<int_const&>(QMultiHash<int,_int> *this,int *key,int *args)

{
  long lVar1;
  bool bVar2;
  QMultiHash<int,_int> *in_RCX;
  int *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  QMultiHash<int,_int> copy;
  QMultiHash<int,_int> *in_stack_ffffffffffffffa8;
  iterator *args_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_00 = in_RDI;
  bVar2 = QMultiHash<int,_int>::isDetached((QMultiHash<int,_int> *)in_RDI);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::shouldGrow
                      (*(Data<QHashPrivate::MultiNode<int,_int>_> **)in_RSI);
    if (bVar2) {
      QMultiHash<int,_int>::emplace_helper<int>(in_RCX,in_RSI,(int *)args_00);
    }
    else {
      emplace_helper<int_const&>(in_RCX,in_RSI,(int *)args_00);
    }
  }
  else {
    QMultiHash<int,_int>::QMultiHash((QMultiHash<int,_int> *)in_RDI,in_stack_ffffffffffffffa8);
    QMultiHash<int,_int>::detach((QMultiHash<int,_int> *)in_RDI);
    emplace_helper<int_const&>(in_RCX,in_RSI,(int *)args_00);
    QMultiHash<int,_int>::~QMultiHash((QMultiHash<int,_int> *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return args_00;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }